

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

cmValue __thiscall cmSourceFile::GetPropertyForUser(cmSourceFile *this,string *prop)

{
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  string *psVar5;
  size_t __n;
  
  __n = prop->_M_string_length;
  if ((__n == propLOCATION_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((prop->_M_dataplus)._M_p,propLOCATION_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    ResolveFullPath(this,(string *)0x0,(string *)0x0);
    __n = prop->_M_string_length;
  }
  if ((__n == propLANGUAGE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((prop->_M_dataplus)._M_p,propLANGUAGE_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    cVar4.Value = GetOrDetermineLanguage_abi_cxx11_(this);
    return (cmValue)cVar4.Value;
  }
  if ((__n == propGENERATED_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((prop->_M_dataplus)._M_p,propGENERATED_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    PVar3 = cmMakefile::GetPolicyStatus((this->Location).Makefile,CMP0118,false);
    psVar5 = &propTRUE_abi_cxx11_;
    if (this->IsGenerated == false) {
      if ((PVar3 < NEW) && (bVar1 = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_), bVar1)) {
        return (cmValue)&propTRUE_abi_cxx11_;
      }
      psVar5 = &propFALSE_abi_cxx11_;
    }
    return (cmValue)psVar5;
  }
  cVar4 = GetProperty(this,prop);
  return (cmValue)cVar4.Value;
}

Assistant:

cmValue cmSourceFile::GetPropertyForUser(const std::string& prop)
{
  // This method is a consequence of design history and backwards
  // compatibility.  GetProperty is (and should be) a const method.
  // Computed properties should not be stored back in the property map
  // but instead reference information already known.  If they need to
  // cache information in a mutable ivar to provide the return string
  // safely then so be it.
  //
  // The LOCATION property is particularly problematic.  The CMake
  // language has very loose restrictions on the names that will match
  // a given source file (for historical reasons).  Implementing
  // lookups correctly with such loose naming requires the
  // cmSourceFileLocation class to commit to a particular full path to
  // the source file as late as possible.  If the users requests the
  // LOCATION property we must commit now.
  if (prop == propLOCATION) {
    // Commit to a location.
    this->ResolveFullPath();
  }

  // Similarly, LANGUAGE can be determined by the file extension
  // if it is requested by the user.
  if (prop == propLANGUAGE) {
    // The pointer is valid until `this->Language` is modified.
    return cmValue(this->GetOrDetermineLanguage());
  }

  // Special handling for GENERATED property.
  if (prop == propGENERATED) {
    // We need to check policy CMP0118 in order to determine if we need to
    // possibly consider the value of a locally set GENERATED property, too.
    auto policyStatus =
      this->Location.GetMakefile()->GetPolicyStatus(cmPolicies::CMP0118);
    if (this->GetIsGenerated(
          (policyStatus == cmPolicies::WARN || policyStatus == cmPolicies::OLD)
            ? CheckScope::GlobalAndLocal
            : CheckScope::Global)) {
      return cmValue(propTRUE);
    }
    return cmValue(propFALSE);
  }

  // Perform the normal property lookup.
  return this->GetProperty(prop);
}